

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

error_code __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::
set_option<asio::detail::socket_option::boolean<6,1>>
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          boolean<6,_1> *option,error_code *ec)

{
  uint uVar1;
  int __level;
  int __optname;
  int *__optval;
  size_t sVar2;
  ulong *in_RCX;
  boolean<6,_1> *in_RDX;
  uint *in_RSI;
  error_code eVar3;
  
  uVar1 = *in_RSI;
  __level = socket_option::boolean<6,_1>::level<asio::ip::tcp>(in_RDX,(tcp *)(in_RSI + 4));
  __optname = socket_option::boolean<6,_1>::name<asio::ip::tcp>(in_RDX,(tcp *)(in_RSI + 4));
  __optval = socket_option::boolean<6,_1>::data<asio::ip::tcp>(in_RDX,(tcp *)(in_RSI + 4));
  sVar2 = socket_option::boolean<6,_1>::size<asio::ip::tcp>(in_RDX,(tcp *)(in_RSI + 4));
  socket_ops::setsockopt
            ((socket_ops *)(ulong)uVar1,(int)in_RSI + 4,__level,__optname,__optval,(socklen_t)sVar2)
  ;
  eVar3._0_8_ = *in_RCX & 0xffffffff;
  eVar3._M_cat = (error_category *)in_RCX[1];
  return eVar3;
}

Assistant:

asio::error_code set_option(implementation_type& impl,
      const Option& option, asio::error_code& ec)
  {
    socket_ops::setsockopt(impl.socket_, impl.state_,
        option.level(impl.protocol_), option.name(impl.protocol_),
        option.data(impl.protocol_), option.size(impl.protocol_), ec);

    ASIO_ERROR_LOCATION(ec);
    return ec;
  }